

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O1

void invalid_deserialize_test(void *data,size_t size,char *description)

{
  _Bool _Var1;
  size_t sVar2;
  roaring_bitmap_t *prVar3;
  
  sVar2 = roaring_bitmap_portable_deserialize_size((char *)data,size);
  if (sVar2 != size) {
    print_error("ERROR: expected size %zu, got %zu\n",size,sVar2);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
          ,0x84);
  }
  sVar2 = roaring_bitmap_portable_deserialize_size((char *)data,size - 1);
  _assert_int_equal(sVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
                    ,0x88);
  prVar3 = roaring_bitmap_portable_deserialize_safe((char *)data,size);
  if (prVar3 != (roaring_bitmap_t *)0x0) {
    _Var1 = roaring_bitmap_internal_validate(prVar3,(char **)0x0);
    if (_Var1) {
      print_error("ERROR: Validation must fail if a bitmap was returned, %s\n",description);
      _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
            ,0x8e);
    }
    roaring_bitmap_free(prVar3);
  }
  prVar3 = roaring_bitmap_portable_deserialize_safe((char *)data,size - 1);
  _assert_true((ulong)(prVar3 == (roaring_bitmap_t *)0x0),"bitmap",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
               ,0x94);
  return;
}

Assistant:

static void invalid_deserialize_test(const void* data, size_t size,
                                     const char* description) {
    // Ensure that the data _looks_ like a valid bitmap, but is not.
    size_t serialized_size =
        roaring_bitmap_portable_deserialize_size(data, size);
    if (serialized_size != size) {
        fail_msg("expected size %zu, got %zu", size, serialized_size);
    }
    // If we truncate the data by one byte, we should get a size of 0
    assert_int_equal(roaring_bitmap_portable_deserialize_size(data, size - 1),
                     0);
    roaring_bitmap_t* bitmap =
        roaring_bitmap_portable_deserialize_safe(data, size);
    if (bitmap != NULL) {
        if (roaring_bitmap_internal_validate(bitmap, NULL)) {
            fail_msg("Validation must fail if a bitmap was returned, %s",
                     description);
        }
        roaring_bitmap_free(bitmap);
    }
    // Truncated data will never return a bitmap
    bitmap = roaring_bitmap_portable_deserialize_safe(data, size - 1);
    assert_null(bitmap);
}